

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_get_max_channel_count(cubeb_conflict1 *ctx,uint32_t *max_channels)

{
  snd_pcm_t *psVar1;
  long lVar2;
  void *__s;
  undefined8 uVar3;
  uint *puVar4;
  size_t sVar5;
  long alStack_90 [2];
  undefined4 auStack_80 [2];
  undefined8 auStack_78 [4];
  void *local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  cubeb_stream_params params;
  snd_pcm_hw_params_t *hw_params;
  cubeb_stream_conflict1 *stm;
  uint32_t *puStack_20;
  int r;
  uint32_t *max_channels_local;
  cubeb_conflict1 *ctx_local;
  
  local_48 = 0xac44;
  uStack_50._4_4_ = 2;
  params.format = CUBEB_SAMPLE_FLOAT32LE;
  auStack_78[3] = 0x11a2fe;
  puStack_20 = max_channels;
  max_channels_local = (uint32_t *)ctx;
  sVar5 = (*cubeb_snd_pcm_hw_params_sizeof)();
  lVar2 = -(sVar5 + 0xf & 0xfffffffffffffff0);
  local_58 = (void *)((long)&local_58 + lVar2);
  params._12_8_ = local_58;
  *(undefined8 *)((long)auStack_78 + lVar2 + 0x18) = 0x11a324;
  sVar5 = (*cubeb_snd_pcm_hw_params_sizeof)();
  __s = local_58;
  *(undefined8 *)((long)auStack_78 + lVar2 + 0x18) = 0x11a332;
  memset(__s,0,sVar5);
  if (max_channels_local == (uint32_t *)0x0) {
    *(undefined8 *)((long)auStack_78 + lVar2 + 0x18) = 0x11a35a;
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                  ,0x4b3,"int alsa_get_max_channel_count(cubeb *, uint32_t *)");
  }
  *(long *)((long)alStack_90 + lVar2 + 8) = (long)&uStack_50 + 4;
  *(undefined4 *)((long)auStack_80 + lVar2) = 100;
  *(undefined8 *)((long)auStack_78 + lVar2) = 0;
  *(undefined8 *)((long)auStack_78 + lVar2 + 8) = 0;
  *(undefined8 *)((long)auStack_78 + lVar2 + 0x10) = 0;
  *(undefined8 *)((long)alStack_90 + lVar2) = 0x11a3a8;
  stm._4_4_ = alsa_stream_init(*(cubeb_conflict1 **)((long)&stm + lVar2),
                               *(cubeb_stream_conflict1 ***)((long)&hw_params + lVar2),
                               *(char **)((long)&params + lVar2 + 0xc),
                               *(cubeb_devid *)((long)&params + lVar2 + 4),
                               *(cubeb_stream_params **)((long)&local_48 + lVar2),
                               *(cubeb_devid *)((long)&uStack_50 + lVar2),
                               *(cubeb_stream_params **)((long)&ctx_local + lVar2),
                               *(uint *)(&stack0xfffffffffffffff8 + lVar2),
                               *(cubeb_data_callback_conflict1 *)(&stack0x00000000 + lVar2),
                               *(cubeb_state_callback_conflict1 *)(&stack0x00000008 + lVar2),
                               *(void **)(&stack0x00000010 + lVar2));
  uVar3 = params._12_8_;
  if (stm._4_4_ == 0) {
    if (hw_params == (snd_pcm_hw_params_t *)0x0) {
      *(undefined8 *)((long)auStack_78 + lVar2 + 0x18) = 0x11a3e9;
      __assert_fail("stm",
                    "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                    ,0x4bb,"int alsa_get_max_channel_count(cubeb *, uint32_t *)");
    }
    psVar1 = *(snd_pcm_t **)(hw_params + 0x38);
    *(undefined8 *)((long)auStack_78 + lVar2 + 0x18) = 0x11a3fe;
    stm._4_4_ = (*cubeb_snd_pcm_hw_params_any)(psVar1,(snd_pcm_hw_params_t *)uVar3);
    puVar4 = puStack_20;
    uVar3 = params._12_8_;
    if (stm._4_4_ < 0) {
      ctx_local._4_4_ = -1;
    }
    else {
      *(undefined8 *)((long)auStack_78 + lVar2 + 0x18) = 0x11a421;
      stm._4_4_ = (*cubeb_snd_pcm_hw_params_get_channels_max)((snd_pcm_hw_params_t *)uVar3,puVar4);
      if (stm._4_4_ < 0) {
        ctx_local._4_4_ = -1;
      }
      else {
        *(undefined8 *)((long)auStack_78 + lVar2 + 0x18) = 0x11a43c;
        alsa_stream_destroy(*(cubeb_stream_conflict1 **)((long)&uStack_50 + lVar2));
        ctx_local._4_4_ = 0;
      }
    }
  }
  else {
    ctx_local._4_4_ = -1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int
alsa_get_max_channel_count(cubeb * ctx, uint32_t * max_channels)
{
  int r;
  cubeb_stream * stm;
  snd_pcm_hw_params_t * hw_params;
  cubeb_stream_params params;
  params.rate = 44100;
  params.format = CUBEB_SAMPLE_FLOAT32NE;
  params.channels = 2;

  snd_pcm_hw_params_alloca(&hw_params);

  assert(ctx);

  r = alsa_stream_init(ctx, &stm, "", NULL, NULL, NULL, &params, 100, NULL,
                       NULL, NULL);
  if (r != CUBEB_OK) {
    return CUBEB_ERROR;
  }

  assert(stm);

  r = WRAP(snd_pcm_hw_params_any)(stm->pcm, hw_params);
  if (r < 0) {
    return CUBEB_ERROR;
  }

  r = WRAP(snd_pcm_hw_params_get_channels_max)(hw_params, max_channels);
  if (r < 0) {
    return CUBEB_ERROR;
  }

  alsa_stream_destroy(stm);

  return CUBEB_OK;
}